

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall cmGeneratorTarget::HaveBuildTreeRPATH(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  cmLinkImplementationLibraries *pcVar2;
  bool bVar3;
  allocator<char> local_39;
  string build_rpath;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&build_rpath,"SKIP_BUILD_RPATH",&local_39);
  bVar1 = GetPropertyAsBool(this,&build_rpath);
  std::__cxx11::string::~string((string *)&build_rpath);
  if (bVar1) {
    bVar3 = false;
  }
  else {
    build_rpath._M_dataplus._M_p = (pointer)&build_rpath.field_2;
    build_rpath._M_string_length = 0;
    build_rpath.field_2._M_local_buf[0] = '\0';
    bVar1 = GetBuildRPATH(this,config,&build_rpath);
    bVar3 = true;
    if (!bVar1) {
      pcVar2 = GetLinkImplementationLibraries(this,config,Link);
      if (pcVar2 == (cmLinkImplementationLibraries *)0x0) {
        bVar3 = false;
      }
      else {
        bVar3 = (pcVar2->Libraries).
                super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                super__Vector_impl_data._M_start !=
                (pcVar2->Libraries).
                super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                super__Vector_impl_data._M_finish;
      }
    }
    std::__cxx11::string::~string((string *)&build_rpath);
  }
  return bVar3;
}

Assistant:

bool cmGeneratorTarget::HaveBuildTreeRPATH(const std::string& config) const
{
  if (this->GetPropertyAsBool("SKIP_BUILD_RPATH")) {
    return false;
  }
  std::string build_rpath;
  if (this->GetBuildRPATH(config, build_rpath)) {
    return true;
  }
  if (cmLinkImplementationLibraries const* impl =
        this->GetLinkImplementationLibraries(config, LinkInterfaceFor::Link)) {
    return !impl->Libraries.empty();
  }
  return false;
}